

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MatrixBandPartLayerParams::SerializeWithCachedSizes
          (MatrixBandPartLayerParams *this,CodedOutputStream *output)

{
  int64 iVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  MatrixBandPartLayerParams *this_local;
  
  iVar1 = numlower(this);
  if (iVar1 != 0) {
    iVar1 = numlower(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar1,output);
  }
  iVar1 = numupper(this);
  if (iVar1 != 0) {
    iVar1 = numupper(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(2,iVar1,output);
  }
  return;
}

Assistant:

void MatrixBandPartLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MatrixBandPartLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 numLower = 1;
  if (this->numlower() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->numlower(), output);
  }

  // int64 numUpper = 2;
  if (this->numupper() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->numupper(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MatrixBandPartLayerParams)
}